

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v9::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  compare(this,other);
  uVar4 = other->exp_ - this->exp_;
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 == 0) {
    uVar5 = 0;
  }
  else {
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar6 = 0;
    lVar8 = 0;
    do {
      uVar9 = uVar4 + (int)sVar6;
      uVar5 = (ulong)puVar3[uVar9] + (lVar8 - (ulong)puVar2[sVar6]);
      puVar3[uVar9] = (uint)uVar5;
      lVar8 = (long)uVar5 >> 0x3f;
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
    uVar5 = uVar5 >> 0x3f;
    uVar4 = uVar4 + (int)sVar6;
  }
  if ((int)uVar5 != 0) {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar7 = (ulong)puVar2[uVar4];
    do {
      uVar7 = (uVar7 & 0xffffffff) - uVar5;
      uVar5 = uVar7 >> 0x3f;
    } while ((long)uVar7 < 0);
    puVar2[uVar4] = (uint)uVar7;
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }